

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O2

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  uv_write_t *req;
  undefined8 uVar2;
  long lVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uv_write_t *base;
  long lVar7;
  uv_buf_t uVar8;
  char *pcVar9;
  char *pcVar10;
  int64_t eval_a;
  char *local_70;
  uv_buf_t bufs [3];
  
  bytes_written = 0;
  bytes_read = 0;
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    req = (uv_write_t *)malloc(0x60c8);
    if (req == (uv_write_t *)0x0) {
      pcVar5 = "!=";
      pcVar10 = "!=";
      eval_a = 0;
      pcVar9 = (char *)0x0;
      pcVar6 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar4 = "write_info";
      uVar2 = 0x45;
      goto LAB_0014d7ea;
    }
    base = req + 1;
    for (lVar3 = 8; lVar3 != 0x38; lVar3 = lVar3 + 0x10) {
      memset(base,0x2a,0x2000);
      uVar8 = uv_buf_init((char *)base,0x2000);
      *(char **)((long)bufs + lVar3 + -8) = uVar8.base;
      *(size_t *)((long)&bufs[0].base + lVar3) = uVar8.len;
      base = (uv_write_t *)((long)&base->data + 3);
    }
    iVar1 = uv_write(req,handle,bufs,3,write_cb);
    local_70 = (char *)0x0;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar6 = "0";
      pcVar4 = "r";
      uVar2 = 0x4e;
      eval_a = 0;
      pcVar9 = (char *)(long)iVar1;
      goto LAB_0014d7e8;
    }
  }
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  bufs[0].base = (char *)(long)iVar1;
  if (bufs[0].base == (char *)0x0) {
    iVar1 = uv_run(handle->loop,UV_RUN_DEFAULT);
    bufs[0].base = (char *)(long)iVar1;
    if (bufs[0].base == (char *)0x0) {
      bufs[0].base = (char *)bytes_written;
      eval_a = 0x600000;
      if (bytes_written == 0x600000) {
        bufs[0].base = (char *)bytes_read;
        eval_a = 0x600000;
        if (bytes_read == 0x600000) {
          return;
        }
        pcVar6 = "(256 * 3 * 0x2000)";
        pcVar4 = "bytes_read";
        uVar2 = 0x82;
        pcVar9 = (char *)bytes_read;
      }
      else {
        pcVar6 = "(256 * 3 * 0x2000)";
        pcVar4 = "bytes_written";
        uVar2 = 0x81;
        pcVar9 = (char *)bytes_written;
      }
      goto LAB_0014d7e8;
    }
    uVar2 = 0x7f;
  }
  else {
    uVar2 = 0x7c;
  }
  eval_a = 0;
  pcVar6 = "0";
  pcVar4 = "r";
  pcVar9 = bufs[0].base;
LAB_0014d7e8:
  pcVar10 = "==";
  pcVar5 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0014d7ea:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
          ,uVar2,pcVar4,pcVar5,pcVar6,pcVar9,pcVar10,eval_a);
  abort();
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT_OK(r);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(bytes_written, XFER_SIZE);
  ASSERT_EQ(bytes_read, XFER_SIZE);
}